

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall
pybind11::detail::enum_base::value(enum_base *this,char *name_,object *value,char *doc)

{
  bool bVar1;
  value_error *this_00;
  obj_attr_accessor local_190;
  undefined8 local_170;
  item_accessor local_168;
  pair<pybind11::object,_const_char_*> local_148;
  undefined1 local_132;
  allocator<char> local_131;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  str_attr_accessor local_b0;
  str local_90;
  undefined1 local_88 [8];
  string type_name;
  str name;
  str_attr_accessor local_50;
  dict local_30;
  dict entries;
  char *doc_local;
  object *value_local;
  char *name__local;
  enum_base *this_local;
  
  entries.super_object.super_handle.m_ptr = (object)(object)doc;
  object_api<pybind11::handle>::attr(&local_50,(object_api<pybind11::handle> *)this,"__entries");
  dict::dict<pybind11::detail::accessor_policies::str_attr>(&local_30,&local_50);
  accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_50);
  str::str((str *)((long)&type_name.field_2 + 8),name_);
  bVar1 = dict::contains<pybind11::str&>(&local_30,(str *)((long)&type_name.field_2 + 8));
  if (!bVar1) {
    std::make_pair<pybind11::object&,char_const*&>(&local_148.first,(char **)value);
    local_170 = type_name.field_2._8_8_;
    object_api<pybind11::handle>::operator[]
              (&local_168,(object_api<pybind11::handle> *)&local_30,(handle)type_name.field_2._8_8_)
    ;
    accessor<pybind11::detail::accessor_policies::generic_item>::operator=(&local_168,&local_148);
    accessor<pybind11::detail::accessor_policies::generic_item>::~accessor(&local_168);
    std::pair<pybind11::object,_const_char_*>::~pair(&local_148);
    object_api<pybind11::handle>::attr
              (&local_190,(object_api<pybind11::handle> *)this,(handle)type_name.field_2._8_8_);
    accessor<pybind11::detail::accessor_policies::obj_attr>::operator=(&local_190,value);
    accessor<pybind11::detail::accessor_policies::obj_attr>::~accessor(&local_190);
    str::~str((str *)((long)&type_name.field_2 + 8));
    dict::~dict(&local_30);
    return;
  }
  object_api<pybind11::handle>::attr(&local_b0,(object_api<pybind11::handle> *)this,"__name__");
  str::str<pybind11::detail::accessor_policies::str_attr>(&local_90,&local_b0);
  str::operator_cast_to_string((string *)local_88,&local_90);
  str::~str(&local_90);
  accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_b0);
  local_132 = 1;
  this_00 = (value_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_110,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                 ": element \"");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,name_,&local_131);
  std::operator+(&local_f0,&local_110,&local_130);
  std::operator+(&local_d0,&local_f0,"\" already exists!");
  value_error::runtime_error(this_00,&local_d0);
  local_132 = 0;
  __cxa_throw(this_00,&value_error::typeinfo,value_error::~value_error);
}

Assistant:

PYBIND11_NOINLINE void value(char const* name_, object value, const char *doc = nullptr) {
        dict entries = m_base.attr("__entries");
        str name(name_);
        if (entries.contains(name)) {
            std::string type_name = (std::string) str(m_base.attr("__name__"));
            throw value_error(type_name + ": element \"" + std::string(name_) + "\" already exists!");
        }

        entries[name] = std::make_pair(value, doc);
        m_base.attr(name) = value;
    }